

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fFboNoAttachmentTests.cpp
# Opt level: O3

bool deqp::gles31::Functional::anon_unknown_0::checkFramebufferSize
               (TestLog *log,RenderContext *renderCtx,GLuint framebuffer,IVec2 *size)

{
  ostringstream *poVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  deUint32 err;
  undefined4 extraout_var;
  TestError *this;
  char *pcVar6;
  long lVar7;
  char *pcVar8;
  bool bVar9;
  GLuint vertexBuffer;
  GLuint vertexArray;
  GLuint outsideYPassed;
  GLuint outsideXPassed;
  GLuint insidePassed;
  GLuint query;
  float data [12];
  ProgramSources sources;
  ShaderProgram program;
  undefined4 local_2f4;
  undefined4 local_2f0;
  int local_2ec;
  int local_2e8;
  int local_2e4;
  value_type local_2e0;
  GLuint local_2bc;
  value_type local_2b8;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined1 local_280 [24];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_268 [4];
  ios_base local_208 [24];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_1f0;
  undefined1 local_1d0 [208];
  ShaderProgram local_100;
  long lVar5;
  
  local_2bc = framebuffer;
  iVar4 = (*renderCtx->_vptr_RenderContext[3])(renderCtx);
  lVar5 = CONCAT44(extraout_var,iVar4);
  local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2b8,
             "#version 310 es\nin layout(location = 0) highp vec2 a_position;\n\nvoid main()\n{\n\tgl_Position = vec4(a_position, 0.0, 1.0);\n}\n"
             ,"");
  local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2e0,
             "#version 310 es\nuniform layout(location = 0) highp ivec2 u_expectedSize;\nout layout(location = 0) mediump vec4 f_color;\n\nvoid main()\n{\n\tif (ivec2(gl_FragCoord.xy) != u_expectedSize) discard;\n\tf_color = vec4(1.0, 0.5, 0.25, 1.0);\n}\n"
             ,"");
  memset((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_280,0,0xac);
  local_1d0._0_8_ = (pointer)0x0;
  local_1d0[8] = 0;
  local_1d0._9_7_ = 0;
  local_1d0[0x10] = 0;
  local_1d0._17_8_ = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_280,&local_2b8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(local_268,&local_2e0);
  glu::ShaderProgram::ShaderProgram(&local_100,renderCtx,(ProgramSources *)local_280);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_1d0);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_1f0);
  lVar7 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_280 + lVar7));
    lVar7 = lVar7 + -0x18;
  } while (lVar7 != -0x18);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
    operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
    operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
  }
  local_2e0._M_dataplus._M_p = local_2e0._M_dataplus._M_p & 0xffffffff00000000;
  local_2e4 = 0;
  local_2e8 = 0;
  local_2ec = 0;
  if (local_100.m_program.m_info.linkOk == false) {
    glu::operator<<(log,&local_100);
  }
  if ((local_100.m_program.m_info.linkOk & 1U) == 0) {
    this = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this,(char *)0x0,"program.isOk()",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fFboNoAttachmentTests.cpp"
               ,0x60);
  }
  else {
    (**(code **)(lVar5 + 0x1680))(local_100.m_program.m_program);
    (**(code **)(lVar5 + 0x5e0))(0xb71);
    (**(code **)(lVar5 + 0x4a0))(0x207);
    (**(code **)(lVar5 + 0x78))(0x8ca9,local_2bc);
    (**(code **)(lVar5 + 0x1a00))(0,0,size->m_data[0] * 2,size->m_data[1] * 2);
    poVar1 = (ostringstream *)(local_280 + 8);
    local_280._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Using ",6);
    std::ostream::operator<<(poVar1,size->m_data[0] * 2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"x",1);
    std::ostream::operator<<(poVar1,size->m_data[1] * 2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," viewport",9);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_280,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_208);
    poVar1 = (ostringstream *)(local_280 + 8);
    local_280._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Discarding fragments outside pixel of interest",0x2e);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_280,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_208);
    poVar1 = (ostringstream *)(local_280 + 8);
    local_280._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Using occlusion query to check for rendered fragments",0x35);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_280,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_208);
    iVar4 = (**(code **)(lVar5 + 0x170))(0x8ca9);
    if (iVar4 == 0x8cd5) {
      local_298 = 0xbf8000003f800000;
      uStack_290 = 0xbf800000bf800000;
      local_2b8.field_2._M_allocated_capacity = 0x3f800000bf800000;
      local_2b8.field_2._8_8_ = 0x3f800000bf800000;
      local_2b8._M_dataplus._M_p = (pointer)0x3f8000003f800000;
      local_2b8._M_string_length._0_4_ = 0x3f800000;
      local_2b8._M_string_length._4_4_ = 0xbf800000;
      local_2f0 = 0;
      local_2f4 = 0;
      (**(code **)(lVar5 + 0x6e0))(1,&local_2e0);
      (**(code **)(lVar5 + 0x708))(1,&local_2f0);
      (**(code **)(lVar5 + 0xd8))(local_2f0);
      (**(code **)(lVar5 + 0x6c8))(1,&local_2f4);
      (**(code **)(lVar5 + 0x40))(0x8892,local_2f4);
      (**(code **)(lVar5 + 0x150))(0x8892,0x30,&local_2b8,0x88e4);
      (**(code **)(lVar5 + 0x610))(0);
      (**(code **)(lVar5 + 0x19f0))(0,2,0x1406,0,0,0);
      (**(code **)(lVar5 + 0x1530))(0,size->m_data[0] + -1,size->m_data[1] + -1);
      (**(code **)(lVar5 + 0x20))(0x8c2f,(ulong)local_2e0._M_dataplus._M_p & 0xffffffff);
      (**(code **)(lVar5 + 0x538))(4,0,6);
      (**(code **)(lVar5 + 0x628))(0x8c2f);
      (**(code **)(lVar5 + 0xa20))((ulong)local_2e0._M_dataplus._M_p & 0xffffffff,0x8866,&local_2e4)
      ;
      poVar1 = (ostringstream *)(local_280 + 8);
      local_280._0_8_ = log;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"A fragment was not discarded at (",0x21);
      std::ostream::operator<<(poVar1,size->m_data[0] + -1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
      std::ostream::operator<<(poVar1,size->m_data[1] + -1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"). ",3);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"Occlusion query reports it was ",0x1f);
      pcVar8 = "rendered.";
      pcVar6 = "rendered.";
      if (local_2e4 == 0) {
        pcVar6 = "not rendered";
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,pcVar6,(ulong)(local_2e4 == 0) * 3 + 9);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_280,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base(local_208);
      (**(code **)(lVar5 + 0x1530))(0,size->m_data[0],size->m_data[1] + -1);
      (**(code **)(lVar5 + 0x20))(0x8c2f,(ulong)local_2e0._M_dataplus._M_p & 0xffffffff);
      (**(code **)(lVar5 + 0x538))(4,0,6);
      (**(code **)(lVar5 + 0x628))(0x8c2f);
      (**(code **)(lVar5 + 0xa20))((ulong)local_2e0._M_dataplus._M_p & 0xffffffff,0x8866,&local_2e8)
      ;
      poVar1 = (ostringstream *)(local_280 + 8);
      local_280._0_8_ = log;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"A fragment was not discarded at (",0x21);
      std::ostream::operator<<(poVar1,size->m_data[0]);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
      std::ostream::operator<<(poVar1,size->m_data[1] + -1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"). ",3);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"Occlusion query reports it was ",0x1f);
      pcVar6 = "rendered.";
      if (local_2e8 == 0) {
        pcVar6 = "not rendered";
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,pcVar6,(ulong)(local_2e8 == 0) * 3 + 9);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_280,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base(local_208);
      (**(code **)(lVar5 + 0x1530))(0,size->m_data[0] + -1,size->m_data[1]);
      (**(code **)(lVar5 + 0x20))(0x8c2f,(ulong)local_2e0._M_dataplus._M_p & 0xffffffff);
      (**(code **)(lVar5 + 0x538))(4,0,6);
      (**(code **)(lVar5 + 0x628))(0x8c2f);
      (**(code **)(lVar5 + 0xa20))((ulong)local_2e0._M_dataplus._M_p & 0xffffffff,0x8866,&local_2ec)
      ;
      poVar1 = (ostringstream *)(local_280 + 8);
      local_280._0_8_ = log;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"A fragment was not discarded at (",0x21);
      std::ostream::operator<<(poVar1,size->m_data[0] + -1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
      std::ostream::operator<<(poVar1,size->m_data[1]);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"). ",3);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"Occlusion query reports it was ",0x1f);
      if (local_2ec == 0) {
        pcVar8 = "not rendered";
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,pcVar8,(ulong)(local_2ec == 0) * 3 + 9);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_280,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base(local_208);
      (**(code **)(lVar5 + 0x518))(0);
      (**(code **)(lVar5 + 0x40))(0x8892,0);
      (**(code **)(lVar5 + 0xd8))(0);
      (**(code **)(lVar5 + 0x438))(1,&local_2f4);
      (**(code **)(lVar5 + 0x490))(1,&local_2f0);
      (**(code **)(lVar5 + 0x458))(1,&local_2e0);
      err = (**(code **)(lVar5 + 0x800))();
      glu::checkError(err,"Query failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fFboNoAttachmentTests.cpp"
                      ,0xa9);
      bVar9 = local_2e4 != 0;
      bVar2 = local_2ec == 0;
      bVar3 = local_2e8 == 0;
      glu::ShaderProgram::~ShaderProgram(&local_100);
      return (bVar2 && bVar3) && bVar9;
    }
    this = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this,(char *)0x0,
               "gl.checkFramebufferStatus(GL_DRAW_FRAMEBUFFER) == GL_FRAMEBUFFER_COMPLETE",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fFboNoAttachmentTests.cpp"
               ,0x6c);
  }
  __cxa_throw(this,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

bool checkFramebufferSize (TestLog& log, const glu::RenderContext& renderCtx, GLuint framebuffer, const IVec2& size)
{
	const glw::Functions&		gl				= renderCtx.getFunctions();

	const char* const			vertexSource	= "#version 310 es\n"
												  "in layout(location = 0) highp vec2 a_position;\n\n"
												  "void main()\n"
												  "{\n"
												  "	gl_Position = vec4(a_position, 0.0, 1.0);\n"
												  "}\n";

	const char* const			fragmentSource	= "#version 310 es\n"
												  "uniform layout(location = 0) highp ivec2 u_expectedSize;\n"
												  "out layout(location = 0) mediump vec4 f_color;\n\n"
												  "void main()\n"
												  "{\n"
												  "	if (ivec2(gl_FragCoord.xy) != u_expectedSize) discard;\n"
												  "	f_color = vec4(1.0, 0.5, 0.25, 1.0);\n"
												  "}\n";

	const glu::ShaderProgram	program			(renderCtx, glu::makeVtxFragSources(vertexSource, fragmentSource));
	GLuint						query			= 0;
	GLuint						insidePassed	= 0;
	GLuint						outsideXPassed	= 0;
	GLuint						outsideYPassed	= 0;

	if (!program.isOk())
		log << program;

	TCU_CHECK(program.isOk());

	gl.useProgram(program.getProgram());
	gl.enable(GL_DEPTH_TEST);
	gl.depthFunc(GL_ALWAYS);
	gl.bindFramebuffer(GL_DRAW_FRAMEBUFFER, framebuffer);
	gl.viewport(0, 0, size.x()*2, size.y()*2); // Oversized viewport so that it will not accidentally limit us to the correct size

	log << TestLog::Message << "Using " << size.x()*2 << "x" << size.y()*2 << " viewport" << TestLog::EndMessage;
	log << TestLog::Message << "Discarding fragments outside pixel of interest" << TestLog::EndMessage;
	log << TestLog::Message << "Using occlusion query to check for rendered fragments" << TestLog::EndMessage;

	TCU_CHECK(gl.checkFramebufferStatus(GL_DRAW_FRAMEBUFFER) == GL_FRAMEBUFFER_COMPLETE);

	// Render
	{
		const float data[] =
		{
			 1.0f,  1.0f,
			 1.0f, -1.0f,
			-1.0f,  1.0f,
			-1.0f,  1.0f,
			 1.0f, -1.0f,
			-1.0f, -1.0f,
		};

		GLuint vertexArray	= 0;
		GLuint vertexBuffer	= 0;

		gl.genQueries(1, &query);
		gl.genVertexArrays(1, &vertexArray);
		gl.bindVertexArray(vertexArray);

		gl.genBuffers(1, &vertexBuffer);
		gl.bindBuffer(GL_ARRAY_BUFFER, vertexBuffer);
		gl.bufferData(GL_ARRAY_BUFFER, sizeof(data), data, GL_STATIC_DRAW);

		gl.enableVertexAttribArray(0);
		gl.vertexAttribPointer(0, 2, GL_FLOAT, false, 0, DE_NULL);

		gl.uniform2i(0, size.x()-1, size.y()-1);
		gl.beginQuery(GL_ANY_SAMPLES_PASSED, query);
		gl.drawArrays(GL_TRIANGLES, 0, 6);
		gl.endQuery(GL_ANY_SAMPLES_PASSED);
		gl.getQueryObjectuiv(query, GL_QUERY_RESULT, &insidePassed);
		log << TestLog::Message << "A fragment was not discarded at (" << size.x()-1 << ", " << size.y()-1 << "). "
			<< "Occlusion query reports it was " << (insidePassed > 0 ? "rendered." : "not rendered") << TestLog::EndMessage;

		gl.uniform2i(0, size.x(), size.y()-1);
		gl.beginQuery(GL_ANY_SAMPLES_PASSED, query);
		gl.drawArrays(GL_TRIANGLES, 0, 6);
		gl.endQuery(GL_ANY_SAMPLES_PASSED);
		gl.getQueryObjectuiv(query, GL_QUERY_RESULT, &outsideXPassed);
		log << TestLog::Message << "A fragment was not discarded at (" << size.x() << ", " << size.y()-1 << "). "
			<< "Occlusion query reports it was " << (outsideXPassed > 0 ? "rendered." : "not rendered") << TestLog::EndMessage;

		gl.uniform2i(0, size.x()-1, size.y());
		gl.beginQuery(GL_ANY_SAMPLES_PASSED, query);
		gl.drawArrays(GL_TRIANGLES, 0, 6);
		gl.endQuery(GL_ANY_SAMPLES_PASSED);
		gl.getQueryObjectuiv(query, GL_QUERY_RESULT, &outsideYPassed);
		log << TestLog::Message << "A fragment was not discarded at (" << size.x()-1 << ", " << size.y() << "). "
			<< "Occlusion query reports it was " << (outsideYPassed > 0 ? "rendered." : "not rendered") << TestLog::EndMessage;

		gl.disableVertexAttribArray(0);
		gl.bindBuffer(GL_ARRAY_BUFFER, 0);
		gl.bindVertexArray(0);
		gl.deleteBuffers(1, &vertexBuffer);
		gl.deleteVertexArrays(1, &vertexArray);
	}

	gl.deleteQueries(1, &query);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Query failed");

	return insidePassed && !outsideXPassed && !outsideYPassed;
}